

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

Component __thiscall
ftxui::Input(ftxui *this,WideStringRef *content,ConstStringRef *placeholder,
            Ref<ftxui::InputOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_38 [24];
  Ref<ftxui::InputOption> *option_local;
  ConstStringRef *placeholder_local;
  WideStringRef *content_local;
  
  local_38._16_8_ = option;
  option_local = (Ref<ftxui::InputOption> *)placeholder;
  placeholder_local = (ConstStringRef *)content;
  content_local = (WideStringRef *)this;
  Make<ftxui::WideInputBase,ftxui::WideStringRef&,ftxui::ConstStringRef&,ftxui::Ref<ftxui::InputOption>>
            ((WideStringRef *)local_38,(ConstStringRef *)content,
             (Ref<ftxui::InputOption> *)placeholder);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::WideInputBase,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,(shared_ptr<ftxui::WideInputBase> *)local_38);
  std::shared_ptr<ftxui::WideInputBase>::~shared_ptr((shared_ptr<ftxui::WideInputBase> *)local_38);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Input(WideStringRef content,
                ConstStringRef placeholder,
                Ref<InputOption> option) {
  return Make<WideInputBase>(content, placeholder, std::move(option));
}